

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asio_service_test.cxx
# Opt level: O2

int asio_service_test::try_adding_server
              (RaftAsioPkg *leader,RaftAsioPkg *srv_to_add,size_t count_limit)

{
  ulong uVar1;
  cmd_result_code cVar2;
  cmd_result_code __val;
  ulong uVar3;
  ptr<cmd_result<ptr<buffer>_>_> ret;
  ptr<srv_config> s_conf;
  string local_90;
  string local_70;
  string ret_string;
  
  uVar1 = 0;
  do {
    uVar3 = uVar1;
    if (count_limit == uVar3) break;
    std::__shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&s_conf.super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2> *)
               ((srv_to_add->sMgr).super___shared_ptr<nuraft::state_mgr,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr + 8));
    nuraft::raft_server::add_srv
              ((raft_server *)&ret,
               (srv_config *)
               (leader->raftServer).
               super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    std::__cxx11::to_string
              (&local_90,
               (s_conf.super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               id_);
    std::operator+(&ret_string,"adding S",&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    cVar2 = nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>::
            get_result_code(ret.
                            super___shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr);
    if (cVar2 != OK) {
      __val = nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>
              ::get_result_code(ret.
                                super___shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr);
      std::__cxx11::to_string(&local_70,__val);
      std::operator+(&local_90," failed: ",&local_70);
      std::__cxx11::string::append((string *)&ret_string);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_70);
    }
    TestSuite::sleep_sec(1,&ret_string);
    std::__cxx11::string::~string((string *)&ret_string);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&ret.
                super___shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&s_conf.super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    uVar1 = uVar3 + 1;
  } while (cVar2 != OK);
  return (uVar3 < count_limit) - 1;
}

Assistant:

int try_adding_server( RaftAsioPkg& leader,
                       const RaftAsioPkg& srv_to_add,
                       size_t count_limit = 3 )
{
    for (size_t ii = 0; ii < count_limit; ++ii) {
        ptr<srv_config> s_conf = srv_to_add.getTestMgr()->get_srv_config();
        ptr< cmd_result< ptr<buffer> > > ret = leader.raftServer->add_srv(*s_conf);

        std::string ret_string = "adding S" + std::to_string(s_conf->get_id());
        bool succeeded = false;

        if (ret->get_result_code() == cmd_result_code::OK) {
            succeeded = true;
        } else {
            ret_string += " failed: " + std::to_string(ret->get_result_code());
        }
        TestSuite::sleep_sec(1, ret_string);
        if (succeeded) {
            return 0;
        }
    }
    return -1;
}